

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIImage.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIImage::setImage(CGUIImage *this,ITexture *image)

{
  _func_int **in_RSI;
  IReferenceCounted *in_RDI;
  
  if (in_RSI != in_RDI[0xd]._vptr_IReferenceCounted) {
    if (in_RDI[0xd]._vptr_IReferenceCounted != (_func_int **)0x0) {
      IReferenceCounted::drop(in_RDI);
    }
    in_RDI[0xd]._vptr_IReferenceCounted = in_RSI;
    if (in_RDI[0xd]._vptr_IReferenceCounted != (_func_int **)0x0) {
      IReferenceCounted::grab
                ((IReferenceCounted *)
                 ((long)in_RDI[0xd]._vptr_IReferenceCounted +
                 *(long *)(*in_RDI[0xd]._vptr_IReferenceCounted + -0x18)));
    }
  }
  return;
}

Assistant:

void CGUIImage::setImage(video::ITexture *image)
{
	if (image == Texture)
		return;

	if (Texture)
		Texture->drop();

	Texture = image;

	if (Texture)
		Texture->grab();
}